

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

string * flatbuffers::RelativeToRootPath
                   (string *__return_storage_ptr__,string *project,string *filepath)

{
  char *pcVar1;
  char cVar2;
  char *path;
  char *path_00;
  long lVar3;
  long lVar4;
  long lVar5;
  string absolute_filepath;
  string absolute_project;
  string local_90;
  string local_70;
  string local_50;
  
  AbsolutePath(&local_90,project);
  PosixPath_abi_cxx11_(&local_50,(flatbuffers *)local_90._M_dataplus._M_p,path);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (local_50._M_dataplus._M_p[local_50._M_string_length - 1] != '/') {
    std::__cxx11::string::append((char *)&local_50);
  }
  AbsolutePath(&local_70,filepath);
  PosixPath_abi_cxx11_(&local_90,(flatbuffers *)local_70._M_dataplus._M_p,path_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  cVar2 = *local_50._M_dataplus._M_p;
  lVar3 = -1;
  if (cVar2 != '\0') {
    lVar4 = 0;
    lVar5 = 0;
    do {
      if (cVar2 != local_90._M_dataplus._M_p[lVar4]) break;
      if (cVar2 == '/') {
        lVar5 = lVar4;
      }
      cVar2 = local_50._M_dataplus._M_p[lVar4 + 1];
      lVar4 = lVar4 + 1;
    } while (cVar2 != '\0');
    cVar2 = local_50._M_dataplus._M_p[lVar5];
    if (cVar2 != '\0') {
      pcVar1 = local_50._M_dataplus._M_p + lVar5;
      lVar3 = 0;
      do {
        pcVar1 = pcVar1 + 1;
        lVar3 = lVar3 + (ulong)(cVar2 == '/');
        cVar2 = *pcVar1;
      } while (cVar2 != '\0');
      lVar3 = lVar3 + -1;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"//","");
  for (; lVar3 != 0; lVar3 = lVar3 + -1) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  std::__cxx11::string::substr((ulong)&local_70,(ulong)&local_90);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_70._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string RelativeToRootPath(const std::string &project,
                               const std::string &filepath) {
  std::string absolute_project = PosixPath(AbsolutePath(project));
  if (absolute_project.back() != '/') absolute_project += "/";
  std::string absolute_filepath = PosixPath(AbsolutePath(filepath));

  // Find the first character where they disagree.
  // The previous directory is the lowest common ancestor;
  const char *a = absolute_project.c_str();
  const char *b = absolute_filepath.c_str();
  size_t common_prefix_len = 0;
  while (*a != '\0' && *b != '\0' && *a == *b) {
    if (*a == '/') common_prefix_len = a - absolute_project.c_str();
    a++;
    b++;
  }
  // the number of ../ to prepend to b depends on the number of remaining
  // directories in A.
  const char *suffix = absolute_project.c_str() + common_prefix_len;
  size_t num_up = 0;
  while (*suffix != '\0')
    if (*suffix++ == '/') num_up++;
  num_up--;  // last one is known to be '/'.
  std::string result = "//";
  for (size_t i = 0; i < num_up; i++) result += "../";
  result += absolute_filepath.substr(common_prefix_len + 1);

  return result;
}